

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O1

int xar_options(archive_write *a,char *key,char *value)

{
  void *pvVar1;
  bool bVar2;
  int iVar3;
  undefined4 uVar4;
  int *piVar5;
  ulong uVar6;
  char *fmt;
  char *endptr;
  char *local_30;
  
  pvVar1 = a->format_data;
  iVar3 = strcmp(key,"checksum");
  if (iVar3 == 0) {
    if ((value == (char *)0x0) || (iVar3 = strcmp(value,"none"), iVar3 == 0)) {
      *(undefined4 *)((long)pvVar1 + 0x84) = 0;
      return 0;
    }
    iVar3 = strcmp(value,"sha1");
    if (iVar3 == 0) {
      *(undefined4 *)((long)pvVar1 + 0x84) = 1;
      return 0;
    }
    iVar3 = strcmp(value,"md5");
    if (iVar3 == 0) {
      *(undefined4 *)((long)pvVar1 + 0x84) = 2;
      return 0;
    }
LAB_0015e66d:
    fmt = "Unknown checksum name: `%s\'";
    goto LAB_0015e829;
  }
  iVar3 = strcmp(key,"compression");
  if (iVar3 != 0) {
    iVar3 = strcmp(key,"compression-level");
    if (iVar3 == 0) {
      if (((value != (char *)0x0) && ((byte)(*value - 0x30U) < 10)) && (value[1] == '\0')) {
        *(uint *)((long)pvVar1 + 0x8c) = (uint)(byte)(*value - 0x30U);
        return 0;
      }
    }
    else {
      iVar3 = strcmp(key,"toc-checksum");
      if (iVar3 == 0) {
        if ((value == (char *)0x0) || (iVar3 = strcmp(value,"none"), iVar3 == 0)) {
          *(undefined4 *)((long)pvVar1 + 0x80) = 0;
          return 0;
        }
        iVar3 = strcmp(value,"sha1");
        if (iVar3 == 0) {
          *(undefined4 *)((long)pvVar1 + 0x80) = 1;
          return 0;
        }
        iVar3 = strcmp(value,"md5");
        if (iVar3 == 0) {
          *(undefined4 *)((long)pvVar1 + 0x80) = 2;
          return 0;
        }
        goto LAB_0015e66d;
      }
      iVar3 = strcmp(key,"threads");
      if (iVar3 != 0) {
        return -0x14;
      }
      if (value == (char *)0x0) {
        return -0x19;
      }
      piVar5 = __errno_location();
      *piVar5 = 0;
      uVar6 = strtoul(value,&local_30,10);
      *(int *)((long)pvVar1 + 0x90) = (int)uVar6;
      if ((*piVar5 == 0) && (*local_30 == '\0')) {
        if ((int)uVar6 == 0) {
          uVar4 = lzma_cputhreads();
          *(undefined4 *)((long)pvVar1 + 0x90) = uVar4;
          return -0x14;
        }
        return -0x14;
      }
      *(undefined4 *)((long)pvVar1 + 0x90) = 1;
    }
    fmt = "Illegal value `%s\'";
    goto LAB_0015e829;
  }
  uVar4 = 0;
  if ((value == (char *)0x0) || (iVar3 = strcmp(value,"none"), uVar4 = 0, iVar3 == 0)) {
LAB_0015e804:
    *(undefined4 *)((long)pvVar1 + 0x88) = uVar4;
    bVar2 = true;
    value = (char *)0x0;
  }
  else {
    iVar3 = strcmp(value,"gzip");
    if (iVar3 == 0) {
      uVar4 = 1;
      goto LAB_0015e804;
    }
    iVar3 = strcmp(value,"bzip2");
    if (iVar3 != 0) {
      iVar3 = strcmp(value,"lzma");
      if (iVar3 == 0) {
        uVar4 = 3;
      }
      else {
        iVar3 = strcmp(value,"xz");
        if (iVar3 != 0) {
          fmt = "Unknown compression name: `%s\'";
          goto LAB_0015e829;
        }
        uVar4 = 4;
      }
      goto LAB_0015e804;
    }
    bVar2 = false;
    value = "bzip2";
  }
  if (bVar2) {
    return 0;
  }
  fmt = "`%s\' compression not supported on this platform";
LAB_0015e829:
  archive_set_error(&a->archive,-1,fmt,value);
  return -0x19;
}

Assistant:

static int
xar_options(struct archive_write *a, const char *key, const char *value)
{
	struct xar *xar;

	xar = (struct xar *)a->format_data;

	if (strcmp(key, "checksum") == 0) {
		if (value == NULL)
			xar->opt_sumalg = CKSUM_NONE;
		else if (strcmp(value, "none") == 0)
			xar->opt_sumalg = CKSUM_NONE;
		else if (strcmp(value, "sha1") == 0)
			xar->opt_sumalg = CKSUM_SHA1;
		else if (strcmp(value, "md5") == 0)
			xar->opt_sumalg = CKSUM_MD5;
		else {
			archive_set_error(&(a->archive),
			    ARCHIVE_ERRNO_MISC,
			    "Unknown checksum name: `%s'",
			    value);
			return (ARCHIVE_FAILED);
		}
		return (ARCHIVE_OK);
	}
	if (strcmp(key, "compression") == 0) {
		const char *name = NULL;

		if (value == NULL)
			xar->opt_compression = NONE;
		else if (strcmp(value, "none") == 0)
			xar->opt_compression = NONE;
		else if (strcmp(value, "gzip") == 0)
			xar->opt_compression = GZIP;
		else if (strcmp(value, "bzip2") == 0)
#if defined(HAVE_BZLIB_H) && defined(BZ_CONFIG_ERROR)
			xar->opt_compression = BZIP2;
#else
			name = "bzip2";
#endif
		else if (strcmp(value, "lzma") == 0)
#if HAVE_LZMA_H
			xar->opt_compression = LZMA;
#else
			name = "lzma";
#endif
		else if (strcmp(value, "xz") == 0)
#if HAVE_LZMA_H
			xar->opt_compression = XZ;
#else
			name = "xz";
#endif
		else {
			archive_set_error(&(a->archive),
			    ARCHIVE_ERRNO_MISC,
			    "Unknown compression name: `%s'",
			    value);
			return (ARCHIVE_FAILED);
		}
		if (name != NULL) {
			archive_set_error(&(a->archive),
			    ARCHIVE_ERRNO_MISC,
			    "`%s' compression not supported "
			    "on this platform",
			    name);
			return (ARCHIVE_FAILED);
		}
		return (ARCHIVE_OK);
	}
	if (strcmp(key, "compression-level") == 0) {
		if (value == NULL ||
		    !(value[0] >= '0' && value[0] <= '9') ||
		    value[1] != '\0') {
			archive_set_error(&(a->archive),
			    ARCHIVE_ERRNO_MISC,
			    "Illegal value `%s'",
			    value);
			return (ARCHIVE_FAILED);
		}
		xar->opt_compression_level = value[0] - '0';
		return (ARCHIVE_OK);
	}
	if (strcmp(key, "toc-checksum") == 0) {
		if (value == NULL)
			xar->opt_toc_sumalg = CKSUM_NONE;
		else if (strcmp(value, "none") == 0)
			xar->opt_toc_sumalg = CKSUM_NONE;
		else if (strcmp(value, "sha1") == 0)
			xar->opt_toc_sumalg = CKSUM_SHA1;
		else if (strcmp(value, "md5") == 0)
			xar->opt_toc_sumalg = CKSUM_MD5;
		else {
			archive_set_error(&(a->archive),
			    ARCHIVE_ERRNO_MISC,
			    "Unknown checksum name: `%s'",
			    value);
			return (ARCHIVE_FAILED);
		}
		return (ARCHIVE_OK);
	}
	if (strcmp(key, "threads") == 0) {
		char *endptr;

		if (value == NULL)
			return (ARCHIVE_FAILED);
		errno = 0;
		xar->opt_threads = (int)strtoul(value, &endptr, 10);
		if (errno != 0 || *endptr != '\0') {
			xar->opt_threads = 1;
			archive_set_error(&(a->archive),
			    ARCHIVE_ERRNO_MISC,
			    "Illegal value `%s'",
			    value);
			return (ARCHIVE_FAILED);
		}
		if (xar->opt_threads == 0) {
#ifdef HAVE_LZMA_STREAM_ENCODER_MT
			xar->opt_threads = lzma_cputhreads();
#else
			xar->opt_threads = 1;
#endif
		}
	}

	/* Note: The "warn" return is just to inform the options
	 * supervisor that we didn't handle it.  It will generate
	 * a suitable error if no one used this option. */
	return (ARCHIVE_WARN);
}